

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

bool absl::cord_internal::CordRepBtree::IsValid(CordRepBtree *tree,bool shallow)

{
  byte bVar1;
  byte bVar2;
  CordRep *edge;
  bool bVar3;
  bool bVar4;
  CordRepBtree *pCVar5;
  int line;
  AlphaNum *a;
  AlphaNum *a_00;
  unsigned_long x;
  char *pcVar6;
  long lVar7;
  string local_d0;
  string local_b0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  if (tree == (CordRepBtree *)0x0) {
    pcVar6 = "tree != nullptr";
    line = 0x1bb;
  }
  else if ((tree->super_CordRep).tag == '\x03') {
    if ((tree->super_CordRep).storage[0] < 0xc) {
      bVar1 = (tree->super_CordRep).storage[1];
      if (bVar1 < 6) {
        bVar2 = (tree->super_CordRep).storage[2];
        if (bVar2 < 7) {
          if (bVar2 < bVar1) {
            pcVar6 = "tree->begin() <= tree->end()";
            line = 0x1c0;
          }
          else {
            lVar7 = (ulong)bVar1 << 3;
            x = 0;
            while( true ) {
              if ((ulong)bVar2 * 8 == lVar7) {
                if (x != (tree->super_CordRep).length) {
                  AlphaNum::AlphaNum(&local_60,x);
                  StrCat_abi_cxx11_(&local_b0,(absl *)&local_60,a);
                  AlphaNum::AlphaNum(&local_90,(tree->super_CordRep).length);
                  StrCat_abi_cxx11_(&local_d0,(absl *)&local_90,a_00);
                  raw_log_internal::RawLog
                            (kError,"cord_rep_btree.cc",0x1cc,
                             "CordRepBtree::CheckValid() FAILED: %s != %s (%s vs %s)","child_length"
                             ,"tree->length",local_b0._M_dataplus._M_p,local_d0._M_dataplus._M_p);
                  std::__cxx11::string::_M_dispose();
                  std::__cxx11::string::_M_dispose();
                  return false;
                }
                if ((shallow) &&
                   ((_ZN4absl13cord_internal12_GLOBAL__N_132cord_btree_exhaustive_validationE_0 & 1)
                    == 0)) {
                  return true;
                }
                if ((tree->super_CordRep).storage[0] == '\0') {
                  return true;
                }
                bVar1 = (tree->super_CordRep).storage[2];
                lVar7 = (ulong)(tree->super_CordRep).storage[1] << 3;
                do {
                  bVar3 = (ulong)bVar1 * 8 == lVar7;
                  if (bVar3) {
                    return bVar3;
                  }
                  pCVar5 = CordRep::btree(*(CordRep **)((long)tree->edges_ + lVar7));
                  bVar4 = IsValid(pCVar5,shallow);
                  lVar7 = lVar7 + 8;
                } while (bVar4);
                return bVar3;
              }
              edge = *(CordRep **)((long)tree->edges_ + lVar7);
              if (edge == (CordRep *)0x0) break;
              if ((tree->super_CordRep).storage[0] == '\0') {
                bVar3 = IsDataEdge(edge);
                if (!bVar3) {
                  pcVar6 = "IsDataEdge(edge)";
                  line = 0x1c8;
                  goto LAB_001313fa;
                }
              }
              else {
                if (edge->tag != '\x03') {
                  pcVar6 = "edge->IsBtree()";
                  line = 0x1c5;
                  goto LAB_001313fa;
                }
                pCVar5 = CordRep::btree(edge);
                if ((tree->super_CordRep).storage[0] - 1 != (uint)(pCVar5->super_CordRep).storage[0]
                   ) {
                  pcVar6 = "edge->btree()->height() == tree->height() - 1";
                  line = 0x1c6;
                  goto LAB_001313fa;
                }
              }
              x = x + edge->length;
              lVar7 = lVar7 + 8;
            }
            pcVar6 = "edge != nullptr";
            line = 0x1c3;
          }
        }
        else {
          pcVar6 = "tree->end() <= tree->capacity()";
          line = 0x1bf;
        }
      }
      else {
        pcVar6 = "tree->begin() < tree->capacity()";
        line = 0x1be;
      }
    }
    else {
      pcVar6 = "tree->height() <= kMaxHeight";
      line = 0x1bd;
    }
  }
  else {
    pcVar6 = "tree->IsBtree()";
    line = 0x1bc;
  }
LAB_001313fa:
  raw_log_internal::RawLog
            (kError,"cord_rep_btree.cc",line,"CordRepBtree::CheckValid() FAILED: %s",pcVar6);
  return false;
}

Assistant:

bool CordRepBtree::IsValid(const CordRepBtree* tree, bool shallow) {
#define NODE_CHECK_VALID(x)                                           \
  if (!(x)) {                                                         \
    ABSL_RAW_LOG(ERROR, "CordRepBtree::CheckValid() FAILED: %s", #x); \
    return false;                                                     \
  }
#define NODE_CHECK_EQ(x, y)                                                    \
  if ((x) != (y)) {                                                            \
    ABSL_RAW_LOG(ERROR,                                                        \
                 "CordRepBtree::CheckValid() FAILED: %s != %s (%s vs %s)", #x, \
                 #y, absl::StrCat(x).c_str(), absl::StrCat(y).c_str());        \
    return false;                                                              \
  }

  NODE_CHECK_VALID(tree != nullptr);
  NODE_CHECK_VALID(tree->IsBtree());
  NODE_CHECK_VALID(tree->height() <= kMaxHeight);
  NODE_CHECK_VALID(tree->begin() < tree->capacity());
  NODE_CHECK_VALID(tree->end() <= tree->capacity());
  NODE_CHECK_VALID(tree->begin() <= tree->end());
  size_t child_length = 0;
  for (CordRep* edge : tree->Edges()) {
    NODE_CHECK_VALID(edge != nullptr);
    if (tree->height() > 0) {
      NODE_CHECK_VALID(edge->IsBtree());
      NODE_CHECK_VALID(edge->btree()->height() == tree->height() - 1);
    } else {
      NODE_CHECK_VALID(IsDataEdge(edge));
    }
    child_length += edge->length;
  }
  NODE_CHECK_EQ(child_length, tree->length);
  if ((!shallow || IsCordBtreeExhaustiveValidationEnabled()) &&
      tree->height() > 0) {
    for (CordRep* edge : tree->Edges()) {
      if (!IsValid(edge->btree(), shallow)) return false;
    }
  }
  return true;

#undef NODE_CHECK_VALID
#undef NODE_CHECK_EQ
}